

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * step_abi_cxx11_(string *__return_storage_ptr__,field_t *f,pos_t *s,bool *back,bool *explore
                        )

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  int iVar5;
  pos_t *ppVar6;
  byte bVar7;
  ostream *this;
  long *plVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  int iVar18;
  size_type __n;
  pointer pvVar19;
  long lVar20;
  bool bVar21;
  value_type_conflict local_bc;
  field_t *local_b8;
  pos_t *local_b0;
  undefined1 local_a8 [8];
  way_t ways;
  ulong local_88;
  undefined1 local_78 [8];
  way_t wc;
  allocator_type local_42;
  allocator_type local_41;
  uint local_40;
  uint local_3c;
  pointer local_38;
  
  __n = (size_type)R;
  local_bc = 0;
  local_b8 = f;
  ways.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)back;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_78,(long)C,&local_bc,&local_42);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_a8,__n,(value_type *)local_78,&local_41);
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78,
                    (long)wc.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_78);
  }
  (((pointer)((long)local_a8 + (long)s->first * 0x18))->
  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start[s->second]
       = 1;
  pvVar19 = (pointer)0xffffffff;
  local_88 = 0xffffffff;
  local_40 = 0xffffffff;
  local_3c = 0xffffffff;
  local_b0 = s;
  do {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_78,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_a8);
    if (R < 1) {
      bVar17 = true;
      bVar21 = false;
    }
    else {
      uVar9 = (ulong)(uint)C;
      local_38 = (pointer)0x0;
      bVar21 = false;
      bVar7 = 0;
      iVar16 = R;
      wc.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar19;
      do {
        pvVar19 = local_38;
        if (0 < (int)uVar9) {
          puVar1 = (undefined1 *)
                   ((long)&(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1);
          lVar10 = 1;
          do {
            piVar4 = (((pointer)((long)local_a8 + pvVar19 * 0x18))->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start;
            iVar16 = piVar4[lVar10 + -1];
            if (iVar16 == 0) {
              iVar16 = *(int *)(*(long *)&(local_b8->
                                          super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[(long)pvVar19].
                                          super__Vector_base<ECell,_std::allocator<ECell>_>._M_impl.
                                          super__Vector_impl_data + -4 + lVar10 * 4);
              if ((iVar16 - 0x2eU < 0x27) &&
                 ((0x4000220001U >> ((ulong)(iVar16 - 0x2eU) & 0x3f) & 1) != 0)) {
                if ((local_38 != (pointer)0x0) &&
                   (0 < (((pointer)
                         ((long)local_a8 +
                         (undefined1 *)
                         ((long)&pvVar19[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 7) * 0x18))->
                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar10 + -1])) {
                  (((pointer)((long)local_78 + pvVar19 * 0x18))->
                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                  _M_start[lVar10 + -1] = 1;
                  bVar7 = 1;
                }
                if (((long)puVar1 < (long)R) &&
                   (0 < (((pointer)((long)local_a8 + puVar1 * 0x18))->
                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar10 + -1])) {
                  (((pointer)((long)local_78 + pvVar19 * 0x18))->
                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                  _M_start[lVar10 + -1] = 1;
                  bVar7 = 1;
                }
                if ((lVar10 != 1) && (0 < piVar4[lVar10 + -2])) {
                  (((pointer)((long)local_78 + pvVar19 * 0x18))->
                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                  _M_start[lVar10 + -1] = 1;
                  bVar7 = 1;
                }
                if ((lVar10 < C) && (0 < piVar4[lVar10])) {
                  (((pointer)((long)local_78 + pvVar19 * 0x18))->
                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                  _M_start[lVar10 + -1] = 1;
                  bVar7 = 1;
                }
                if ((((pointer)((long)local_78 + pvVar19 * 0x18))->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start[lVar10 + -1] == 1) {
                  uVar15 = (uint)(lVar10 - 1U);
                  if (*(char *)&((ways.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start == '\x01') {
                    if (iVar16 == 0x54) {
LAB_00102655:
                      bVar21 = true;
                      local_40 = (uint)local_38;
                      local_3c = uVar15;
                    }
                  }
                  else if (iVar16 == 0x43) {
                    wc.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
                    local_88 = lVar10 - 1U;
                  }
                  else if ((iVar16 == 0x3f) && (*explore != false)) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"move to ",8);
                    this = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)local_38);
                    std::__ostream_insert<char,std::char_traits<char>>(this,", ",2);
                    plVar8 = (long *)std::ostream::operator<<(this,uVar15);
                    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
                    std::ostream::put((char)plVar8);
                    std::ostream::flush();
                    goto LAB_00102655;
                  }
                }
              }
            }
            else if (0 < iVar16) {
              (((pointer)((long)local_78 + pvVar19 * 0x18))->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start[lVar10 + -1] = iVar16 + 1;
            }
            uVar9 = (ulong)C;
            bVar17 = lVar10 < (long)uVar9;
            lVar10 = lVar10 + 1;
            iVar16 = R;
          } while (bVar17);
        }
        local_38 = (pointer)((long)&(pvVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start + 1);
      } while ((long)local_38 < (long)iVar16);
      bVar17 = (bool)(bVar7 ^ 1 | bVar21);
      pvVar19 = wc.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_a8,
                (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_78);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_78);
    ppVar6 = local_b0;
  } while (!bVar17);
  bVar7 = *explore;
  if ((!bVar21) && ((bVar7 & 1) != 0)) {
    *explore = false;
    bVar7 = 0;
  }
  bVar21 = ((bVar7 | *(byte *)&((ways.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start) & 1) != 0;
  pvVar19 = (pointer)((ulong)pvVar19 & 0xffffffff);
  if (bVar21) {
    pvVar19 = (pointer)(ulong)local_40;
  }
  local_88 = local_88 & 0xffffffff;
  if (bVar21) {
    local_88 = (ulong)local_3c;
  }
  iVar16 = (int)local_88;
  if (0 < R) {
    lVar10 = 0;
    wc.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar19;
    do {
      if (0 < C) {
        lVar20 = 0;
        do {
          *(undefined8 *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) = 3;
          std::ostream::operator<<
                    ((ostream *)&std::cerr,
                     (((pointer)((long)local_a8 + lVar10 * 0x18))->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start[lVar20]);
          lVar20 = lVar20 + 1;
        } while (lVar20 < C);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      lVar10 = lVar10 + 1;
      pvVar19 = wc.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    } while (lVar10 < R);
  }
  iVar18 = (int)pvVar19;
  if (iVar18 == -1) {
    __assert_fail("-1 != e.first",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                  ,0x7e,"std::string step(const field_t &, const pos_t &, bool &, bool &)");
  }
  iVar2 = ppVar6->first;
  iVar3 = ppVar6->second;
  iVar11 = iVar18 - iVar2;
  iVar5 = -iVar11;
  if (0 < iVar11) {
    iVar5 = iVar11;
  }
  iVar12 = iVar16 - iVar3;
  iVar11 = -iVar12;
  if (0 < iVar12) {
    iVar11 = iVar12;
  }
  if (1 < (uint)(iVar11 + iVar5)) {
    do {
      iVar16 = (int)local_88;
      iVar18 = (int)pvVar19;
      if ((iVar18 < 1) ||
         (uVar15 = iVar18 - 1,
         (((pointer)((long)local_a8 + (ulong)uVar15 * 0x18))->
         super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
         [iVar16] <=
         (((pointer)((long)local_a8 + ((ulong)pvVar19 & 0xffffffff) * 0x18))->
         super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
         [iVar16])) {
        uVar15 = iVar18 + 1;
        if (((int)uVar15 < R) &&
           ((((pointer)((long)local_a8 + (long)iVar18 * 0x18))->
            super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
            [iVar16] <
            (((pointer)((long)local_a8 + (long)(int)uVar15 * 0x18))->
            super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
            [iVar16])) goto LAB_00102869;
        if ((iVar16 < 1) ||
           (piVar4 = (((pointer)((long)local_a8 + (long)iVar18 * 0x18))->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start, piVar4[iVar16 - 1U] <= piVar4[local_88])) {
          uVar15 = iVar16 + 1;
          local_88 = (ulong)uVar15;
          if ((C <= (int)uVar15) ||
             (piVar4 = (((pointer)((long)local_a8 + (long)iVar18 * 0x18))->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start, piVar4[(int)uVar15] <= piVar4[iVar16])) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                          ,0x96,"std::string step(const field_t &, const pos_t &, bool &, bool &)");
          }
        }
        else {
          local_88 = (ulong)(iVar16 - 1U);
        }
      }
      else {
LAB_00102869:
        pvVar19 = (pointer)(ulong)uVar15;
      }
      iVar16 = (int)local_88;
      iVar18 = (int)pvVar19;
      iVar13 = iVar18 - iVar2;
      iVar12 = -iVar13;
      if (0 < iVar13) {
        iVar12 = iVar13;
      }
      iVar14 = iVar16 - iVar3;
      iVar13 = -iVar14;
      if (0 < iVar14) {
        iVar13 = iVar14;
      }
    } while (1 < (uint)(iVar13 + iVar12));
    if (1 < (uint)(iVar11 + iVar5)) goto LAB_001028f5;
  }
  *(undefined1 *)
   &((ways.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start = 1;
LAB_001028f5:
  if (iVar18 < iVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"UP","");
  }
  else if (iVar2 < iVar18) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"DOWN","");
  }
  else if (iVar16 < iVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"LEFT","");
  }
  else {
    if (iVar16 <= iVar3) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                    ,0xad,"std::string step(const field_t &, const pos_t &, bool &, bool &)");
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"RIGHT","");
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string step(const field_t& f, const pos_t& s, bool& back, bool& explore)
{
    bool step_taken;
    bool found_way = false;
    way_t ways(R, wrow_t(C, 0));
    ways[s.first][s.second] = 1;
    pos_t e(-1, -1);
    pos_t c(-1, -1);
    do
    {
        step_taken = false;
        way_t wc = ways; 
        for (int y = 0; y < R; y++)
        {
            for (int x = 0; x < C; x++)
            {
                if (0 == ways[y][x]
                    && (EC_HOLLOW == f[y][x]
                        || EC_CONTROL == f[y][x]
                        || EC_START == f[y][x]
                        || EC_UNKNOWN == f[y][x]))
                {
                    if (0 < y && 0 < ways[y - 1][x])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (R > y + 1 && 0 < ways[y + 1][x])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (0 < x && 0 < ways[y][x - 1])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (C > x + 1 && 0 < ways[y][x + 1])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (1 == wc[y][x])
                    {
                        if (back)
                        {
                            if (EC_START == f[y][x])
                            {
                                found_way = true;
                                e = pos_t(y, x);
                            }
                        }
                        else
                        {
                            if (EC_CONTROL == f[y][x])
                            {
                                c = pos_t(y, x);
                            }
                            if (explore && EC_UNKNOWN == f[y][x])
                            {
                                found_way = true;
                                e = pos_t(y, x);
                                std::cerr << "move to " << y << ", " << x << std::endl;
                            }
                        }
                    }
                } else if (0 < ways[y][x])
                {
                    wc[y][x] = 1 + ways[y][x];
                }
            }
        }
        ways = wc;
    } while (step_taken && !found_way);
    
    if (!found_way && explore)
    {
        explore = false;
    }
    
    if (!explore && !back)
    {
        e = c;
    }
    
    for (int y = 0; y < R; y++)
    {
        for (int x = 0; x < C; x++)
        {
            std::cerr.width(3);
            std::cerr << ways[y][x];
        }
        std::cerr << std::endl;
    }

    assert(-1 != e.first);
    
    bool last_step = true;
    while (1 < abs(e.first - s.first) + abs(e.second - s.second))
    {
        //std::cerr << e.first << ", " << e.second << std::endl;
        if (0 < e.first && ways[e.first][e.second] < ways[e.first - 1][e.second])
        {
            e.first--;
        }
        else if (R > e.first + 1 && ways[e.first][e.second] < ways[e.first + 1][e.second])
        {
            e.first++;
        }
        else if (0 < e.second && ways[e.first][e.second] < ways[e.first][e.second - 1])
        {
            e.second--;
        }
        else if (C > e.second + 1 && ways[e.first][e.second] < ways[e.first][e.second + 1])
        {
            e.second++;
        }
        else
        {
            assert(false);
        }
        last_step = false;
    }
    
    if (last_step)
    {
        back = true;
    }
    if (e.first < s.first)
    {
        return "UP";
    } else if (e.first > s.first)
    {
        return "DOWN";
    } else if (e.second < s.second)
    {
        return "LEFT";
    } else if (e.second > s.second)
    {
        return "RIGHT";
    }
    
    assert(false);
}